

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O3

bool duckdb::alp::AlpCompression<float,_true>::CompareALPCombinations
               (AlpCombination *c1,AlpCombination *c2)

{
  bool bVar1;
  
  bVar1 = true;
  if (c1->n_appearances <= c2->n_appearances) {
    if (c1->n_appearances == c2->n_appearances) {
      if (c1->estimated_compression_size < c2->estimated_compression_size) {
        return true;
      }
      if (c1->estimated_compression_size == c2->estimated_compression_size) {
        if ((c2->encoding_indices).exponent < (c1->encoding_indices).exponent) {
          return true;
        }
        if ((c2->encoding_indices).exponent == (c1->encoding_indices).exponent) {
          return (c2->encoding_indices).factor < (c1->encoding_indices).factor;
        }
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool CompareALPCombinations(const AlpCombination &c1, const AlpCombination &c2) {
		return (c1.n_appearances > c2.n_appearances) ||
		       (c1.n_appearances == c2.n_appearances &&
		        (c1.estimated_compression_size < c2.estimated_compression_size)) ||
		       ((c1.n_appearances == c2.n_appearances &&
		         c1.estimated_compression_size == c2.estimated_compression_size) &&
		        (c2.encoding_indices.exponent < c1.encoding_indices.exponent)) ||
		       ((c1.n_appearances == c2.n_appearances &&
		         c1.estimated_compression_size == c2.estimated_compression_size &&
		         c2.encoding_indices.exponent == c1.encoding_indices.exponent) &&
		        (c2.encoding_indices.factor < c1.encoding_indices.factor));
	}